

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O0

void __thiscall
CGL::SceneObjects::InfiniteHemisphereLight::InfiniteHemisphereLight
          (InfiniteHemisphereLight *this,Vector3D *rad)

{
  Vector3D *pVVar1;
  Vector3D *in_RSI;
  SceneLight *in_RDI;
  UniformHemisphereSampler3D *in_stack_ffffffffffffff50;
  undefined8 local_88;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 local_78;
  undefined8 local_70;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_68;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_38;
  
  SceneLight::SceneLight(in_RDI);
  in_RDI->_vptr_SceneLight = (_func_int **)&PTR_sample_L_00140910;
  Vector3D::Vector3D((Vector3D *)(in_RDI + 2),in_RSI);
  Matrix3x3::Matrix3x3((Matrix3x3 *)in_stack_ffffffffffffff80);
  UniformHemisphereSampler3D::UniformHemisphereSampler3D(in_stack_ffffffffffffff50);
  Vector3D::Vector3D((Vector3D *)&local_38.field_0,1.0,0.0,0.0);
  pVVar1 = Matrix3x3::operator[]((Matrix3x3 *)(in_RDI + 6),0);
  (pVVar1->field_0).field_0.x = local_38.field_0.x;
  (pVVar1->field_0).field_0.y = local_38.field_0.y;
  (pVVar1->field_0).field_0.z = local_38.field_0.z;
  *(undefined8 *)((long)&pVVar1->field_0 + 0x18) = local_38._24_8_;
  Vector3D::Vector3D((Vector3D *)&local_68.field_0,0.0,0.0,-1.0);
  pVVar1 = Matrix3x3::operator[]((Matrix3x3 *)(in_RDI + 6),1);
  (pVVar1->field_0).field_0.x = local_68.field_0.x;
  (pVVar1->field_0).field_0.y = local_68.field_0.y;
  (pVVar1->field_0).field_0.z = local_68.field_0.z;
  *(undefined8 *)((long)&pVVar1->field_0 + 0x18) = local_68._24_8_;
  Vector3D::Vector3D((Vector3D *)&stack0xffffffffffffff78,0.0,1.0,0.0);
  pVVar1 = Matrix3x3::operator[]((Matrix3x3 *)(in_RDI + 6),2);
  (pVVar1->field_0).field_0.x = (double)local_88;
  (pVVar1->field_0).field_0.y = (double)in_stack_ffffffffffffff80;
  (pVVar1->field_0).field_0.z = (double)local_78;
  *(undefined8 *)((long)&pVVar1->field_0 + 0x18) = local_70;
  return;
}

Assistant:

InfiniteHemisphereLight::InfiniteHemisphereLight(const Vector3D rad)
    : radiance(rad) {
  sampleToWorld[0] = Vector3D(1,  0,  0);
  sampleToWorld[1] = Vector3D(0,  0, -1);
  sampleToWorld[2] = Vector3D(0,  1,  0);
}